

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O0

bool google::sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
               (StringIO *fp,unsigned_long value,size_t length)

{
  bool bVar1;
  StringIO *in_RDX;
  ulong in_RSI;
  size_t i;
  uchar byte;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  StringIO *fp_00;
  
  fp_00 = (StringIO *)0x0;
  while( true ) {
    if (in_RDX <= fp_00) {
      return true;
    }
    if ((ulong)((long)in_RDX + (-1 - (long)fp_00)) < 8) {
      uVar2 = (uint)(byte)(in_RSI >> ((((char)in_RDX + -1) - (char)fp_00) * '\b' & 0x3fU));
    }
    else {
      uVar2 = 0;
    }
    bVar1 = write_data<StringIO>(fp_00,(void *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),0xf7608f);
    if (!bVar1) break;
    fp_00 = (StringIO *)((long)&fp_00->s_ + 1);
  }
  return false;
}

Assistant:

bool write_bigendian_number(OUTPUT* fp, IntType value, size_t length) {
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    byte = (sizeof(value) <= length - 1 - i)
               ? 0
               : static_cast<unsigned char>((value >> ((length - 1 - i) * 8)) &
                                            255);
    if (!write_data(fp, &byte, sizeof(byte))) return false;
  }
  return true;
}